

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O3

Type * LLVMBC::Type::getTy(LLVMContext *context,TypeID id)

{
  pointer *pppTVar1;
  iterator __position;
  pointer ppTVar2;
  Type *type;
  TypeID local_1c;
  Type *local_18;
  
  ppTVar2 = (context->type_cache).
            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ppTVar2 ==
        (context->type_cache).
        super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_1c = id;
      local_18 = LLVMContext::construct<LLVMBC::Type,LLVMBC::LLVMContext&,LLVMBC::Type::TypeID&>
                           (context,context,&local_1c);
      __position._M_current =
           (context->type_cache).
           super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (context->type_cache).
          super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>::
        _M_realloc_insert<LLVMBC::Type*const&>
                  ((vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>> *)
                   &context->type_cache,__position,&local_18);
      }
      else {
        *__position._M_current = local_18;
        pppTVar1 = &(context->type_cache).
                    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      return local_18;
    }
    if ((*ppTVar2)->type_id == id) break;
    ppTVar2 = ppTVar2 + 1;
  }
  return *ppTVar2;
}

Assistant:

Type *Type::getTy(LLVMContext &context, TypeID id)
{
	auto &cache = context.get_type_cache();
	for (auto *type : cache)
		if (type->getTypeID() == id)
			return type;

	auto *type = context.construct<Type>(context, id);
	cache.push_back(type);
	return type;
}